

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O1

void __thiscall BinaryReaderStrip::~BinaryReaderStrip(BinaryReaderStrip *this)

{
  OutputBuffer *__ptr;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> *this_00;
  
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderStrip_00134600;
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::_M_erase(&(this->sections_to_keep_)._M_t,
             (_Link_type)
             (this->sections_to_keep_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  (this->stream_).super_Stream._vptr_Stream = (_func_int **)&PTR__MemoryStream_001355e0;
  __ptr = (this->stream_).buf_._M_t.
          super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
          super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
          super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
  this_00 = &(this->stream_).buf_;
  if (__ptr != (OutputBuffer *)0x0) {
    std::default_delete<wabt::OutputBuffer>::operator()
              ((default_delete<wabt::OutputBuffer> *)this_00,__ptr);
  }
  (this_00->_M_t).
  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false> =
       (_Head_base<0UL,_wabt::OutputBuffer_*,_false>)0x0;
  return;
}

Assistant:

explicit BinaryReaderStrip(std::set<std::string_view> sections_to_keep,
                             Errors* errors)
      : errors_(errors),
        sections_to_keep_(sections_to_keep),
        section_start_(0) {
    stream_.WriteU32(WABT_BINARY_MAGIC, "WASM_BINARY_MAGIC");
    stream_.WriteU32(WABT_BINARY_VERSION, "WASM_BINARY_VERSION");
  }